

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_p_race(parser *p)

{
  player_race *ppVar1;
  uint uVar2;
  player_race *ppVar3;
  
  ppVar1 = (player_race *)parser_priv(p);
  races = ppVar1;
  if (ppVar1 != (player_race *)0x0) {
    uVar2 = 0xffffffff;
    ppVar3 = ppVar1;
    do {
      ppVar3 = ppVar3->next;
      uVar2 = uVar2 + 1;
    } while (ppVar3 != (player_race *)0x0);
    for (; ppVar1 != (player_race *)0x0; ppVar1 = ppVar1->next) {
      if (uVar2 == 0xffffffff) {
        __assert_fail("num",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xb0b,"errr finish_parse_p_race(struct parser *)");
      }
      ppVar1->ridx = uVar2;
      uVar2 = uVar2 - 1;
    }
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_p_race(struct parser *p) {
	struct player_race *r;
	int num = 0;
	races = parser_priv(p);
	for (r = races; r; r = r->next) num++;
	for (r = races; r; r = r->next, num--) {
		assert(num);
		r->ridx = num - 1;
	}
	parser_destroy(p);
	return 0;
}